

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::attachmentExists
          (AttachmentSizeInitialCase *this,GLenum attachment)

{
  int attachment_00;
  bool bVar1;
  int *piVar2;
  bool local_21;
  undefined1 local_20 [8];
  StateQueryMemoryWriteGuard<int> state;
  GLenum attachment_local;
  AttachmentSizeInitialCase *this_local;
  
  state.m_value = attachment;
  unique0x100000c3 = this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_20);
  attachment_00 = state.m_value;
  piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_20);
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,attachment_00,0x8cd0,piVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::isUndefined
                    ((StateQueryMemoryWriteGuard<int> *)local_20);
  local_21 = false;
  if (!bVar1) {
    piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_20);
    local_21 = *piVar2 != 0;
  }
  return local_21;
}

Assistant:

bool attachmentExists (GLenum attachment)
	{
		StateQueryMemoryWriteGuard<GLint> state;
		glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &state);
		expectError(GL_NO_ERROR);

		return !state.isUndefined() && state != GL_NONE;
	}